

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.c
# Opt level: O0

int wally_secp_randomize(uchar *bytes,size_t bytes_len)

{
  int iVar1;
  secp256k1_context *ctx_00;
  secp256k1_context *ctx;
  size_t bytes_len_local;
  uchar *bytes_local;
  
  if ((bytes == (uchar *)0x0) || (bytes_len != 0x20)) {
    bytes_local._4_4_ = -2;
  }
  else {
    ctx_00 = secp_ctx();
    if (ctx_00 == (secp256k1_context *)0x0) {
      bytes_local._4_4_ = -3;
    }
    else {
      iVar1 = secp256k1_context_randomize(ctx_00,bytes);
      if (iVar1 == 0) {
        bytes_local._4_4_ = -1;
      }
      else {
        bytes_local._4_4_ = 0;
      }
    }
  }
  return bytes_local._4_4_;
}

Assistant:

int wally_secp_randomize(const unsigned char *bytes, size_t bytes_len)
{
    secp256k1_context *ctx;

    if (!bytes || bytes_len != WALLY_SECP_RANDOMIZE_LEN)
        return WALLY_EINVAL;

    if (!(ctx = (secp256k1_context *)secp_ctx()))
        return WALLY_ENOMEM;

    if (!secp256k1_context_randomize(ctx, bytes))
        return WALLY_ERROR;

    return WALLY_OK;
}